

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

bool __thiscall QIconModeViewBase::filterDragMoveEvent(QIconModeViewBase *this,QDragMoveEvent *e)

{
  QDragMoveEvent QVar1;
  QWidget *pQVar2;
  QListViewPrivate *pQVar3;
  QSize QVar4;
  QAbstractItemModel *pQVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  LayoutDirection LVar9;
  int iVar10;
  QListView *pQVar11;
  QPoint QVar12;
  ulong uVar13;
  qsizetype qVar14;
  uint uVar15;
  undefined4 uVar16;
  undefined1 *puVar17;
  ulong uVar18;
  Representation RVar19;
  Representation RVar20;
  undefined8 uVar21;
  int iVar22;
  long in_FS_OFFSET;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  QRect QVar31;
  undefined1 local_98 [16];
  QPoint local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1 = e[0xc];
  e[0xc] = (QDragMoveEvent)0x0;
  pQVar11 = (QListView *)QDropEvent::source();
  if (pQVar11 == (this->super_QCommonListViewBase).qq) {
    bVar8 = QAbstractItemViewPrivate::canDrop
                      (&((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate,
                       (QDropEvent *)e);
    if (bVar8) {
      QVar31 = itemsRect(this,&this->draggedItems);
      pQVar2 = (((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).
               super_QAbstractScrollAreaPrivate.viewport;
      QVar12 = draggedItemsDelta(this);
      local_58.r = QVar12.xp.m_i.m_i + QVar31.x1.m_i.m_i;
      local_58.c = QVar12.yp.m_i.m_i + QVar31.y1.m_i.m_i;
      uVar16 = 0;
      local_58.i = CONCAT44(QVar12.yp.m_i.m_i + QVar31.y2.m_i.m_i,
                            QVar12.xp.m_i.m_i + QVar31.x2.m_i.m_i);
      QWidget::update(pQVar2,(QRect *)&local_58);
      auVar23._0_8_ =
           (double)((ulong)*(double *)(e + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
           *(double *)(e + 0x10);
      auVar23._8_8_ =
           (double)((ulong)*(double *)(e + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
           *(double *)(e + 0x18);
      auVar23 = minpd(_DAT_0066f5d0,auVar23);
      auVar24._8_8_ = -(ulong)(-2147483648.0 < auVar23._8_8_);
      auVar24._0_8_ = -(ulong)(-2147483648.0 < auVar23._0_8_);
      uVar13 = (ulong)(uint)(int)auVar23._0_8_;
      uVar15 = movmskpd(uVar16,auVar24);
      uVar18 = (ulong)(uint)(int)auVar23._8_8_ << 0x20;
      if ((uVar15 & 2) == 0) {
        uVar18 = 0x8000000000000000;
      }
      if ((uVar15 & 1) == 0) {
        uVar13 = 0x80000000;
      }
      this->draggedItemsPos = (QPoint)(uVar13 | uVar18);
      pQVar2 = (((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).
               super_QAbstractScrollAreaPrivate.viewport;
      QVar12 = draggedItemsDelta(this);
      local_58.r = QVar12.xp.m_i.m_i + QVar31.x1.m_i.m_i;
      local_58.c = QVar31.y1.m_i.m_i + QVar12.yp.m_i.m_i;
      local_58.i = CONCAT44(QVar12.yp.m_i.m_i + QVar31.y2.m_i.m_i,
                            QVar12.xp.m_i.m_i + QVar31.x2.m_i.m_i);
      uVar16 = SUB84(&local_58,0);
      QWidget::update(pQVar2,(QRect *)&local_58);
      local_58.r = -1;
      local_58.c = -1;
      local_58.i = 0;
      local_58.m.ptr = (QAbstractItemModel *)0x0;
      pQVar3 = (this->super_QCommonListViewBase).dd;
      if (pQVar3->movement == Snap) {
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        uStack_60 = &DAT_aaaaaaaaaaaaaaaa;
        auVar25._0_8_ =
             (double)((ulong)*(double *)(e + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
             *(double *)(e + 0x10);
        auVar25._8_8_ =
             (double)((ulong)*(double *)(e + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
             *(double *)(e + 0x18);
        auVar23 = minpd(_DAT_0066f5d0,auVar25);
        auVar26._8_8_ = -(ulong)(-2147483648.0 < auVar23._8_8_);
        auVar26._0_8_ = -(ulong)(-2147483648.0 < auVar23._0_8_);
        uVar15 = movmskpd(uVar16,auVar26);
        iVar22 = (int)auVar23._0_8_;
        if ((uVar15 & 1) == 0) {
          iVar22 = -0x80000000;
        }
        iVar6 = (int)auVar23._8_8_;
        if ((uVar15 & 2) == 0) {
          iVar6 = -0x80000000;
        }
        pQVar2 = *(QWidget **)
                  &(pQVar3->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                   super_QFramePrivate.super_QWidgetPrivate.field_0x8;
        LVar9 = QWidget::layoutDirection(pQVar2);
        iVar10 = (**(code **)(*(long *)pQVar2 + 0x2b0))(pQVar2);
        iVar7 = -iVar10;
        if (LVar9 != RightToLeft) {
          iVar7 = iVar10;
        }
        iVar10 = (**(code **)(*(long *)pQVar2 + 0x2b8))(pQVar2);
        QVar4 = ((this->super_QCommonListViewBase).dd)->grid;
        RVar19 = QVar4.wd.m_i;
        iVar22 = (iVar7 + iVar22) - (iVar7 + iVar22) % RVar19.m_i;
        RVar20 = QVar4.ht.m_i;
        uVar15 = (iVar10 + iVar6) - (iVar10 + iVar6) % RVar20.m_i;
        puVar17 = (undefined1 *)(ulong)uVar15;
        local_68 = (undefined1 *)CONCAT44(uVar15,iVar22);
        uStack_60 = (undefined1 *)CONCAT44(RVar20.m_i + -1 + uVar15,RVar19.m_i + iVar22 + -1);
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        local_88 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
        puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
        (*(this->super_QCommonListViewBase)._vptr_QCommonListViewBase[7])(&local_88,this);
        if (local_78 == (undefined1 *)0x0) {
          local_98 = (undefined1  [16])0x0;
          local_58._0_8_ = -1;
        }
        else {
          local_58._0_8_ = *(undefined8 *)(puStack_80 + (long)local_78 * 0x18 + -0x18);
          local_98 = *(undefined1 (*) [16])(puStack_80 + (long)local_78 * 0x18 + -0x10);
          puVar17 = puStack_80;
        }
        uVar16 = SUB84(puVar17,0);
        local_58.i = local_98._0_8_;
        local_58.m.ptr = (QAbstractItemModel *)local_98._8_8_;
        if (local_88 != (QPoint)0x0) {
          LOCK();
          *(int *)local_88 = *(int *)local_88 + -1;
          UNLOCK();
          if (*(int *)local_88 == 0) {
            QArrayData::deallocate((QArrayData *)local_88,0x18,0x10);
          }
        }
      }
      else {
        auVar27._0_8_ =
             (double)((ulong)*(double *)(e + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
             *(double *)(e + 0x10);
        auVar27._8_8_ =
             (double)((ulong)*(double *)(e + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
             *(double *)(e + 0x18);
        auVar23 = minpd(_DAT_0066f5d0,auVar27);
        auVar28._8_8_ = -(ulong)(-2147483648.0 < auVar23._8_8_);
        auVar28._0_8_ = -(ulong)(-2147483648.0 < auVar23._0_8_);
        uVar13 = (ulong)(uint)(int)auVar23._0_8_;
        uVar15 = movmskpd(uVar16,auVar28);
        uVar18 = (ulong)(uint)(int)auVar23._8_8_ << 0x20;
        if ((uVar15 & 2) == 0) {
          uVar18 = 0x8000000000000000;
        }
        uVar16 = 0x80000000;
        if ((uVar15 & 1) == 0) {
          uVar13 = 0x80000000;
        }
        local_88 = (QPoint)(uVar13 | uVar18);
        (**(code **)(*(long *)&(((this->super_QCommonListViewBase).qq)->super_QAbstractItemView).
                               super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x1f0))
                  (&local_58);
      }
      qVar14 = QtPrivate::indexOf<QModelIndex,QModelIndex>(&this->draggedItems,&local_58,0);
      if (qVar14 == -1) {
        pQVar5 = (((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).model;
        uVar13 = (**(code **)(*(long *)pQVar5 + 0x138))(pQVar5,&local_58);
        if (((((uVar13 & 8) != 0) || (local_58.r < 0)) || ((long)local_58._0_8_ < 0)) ||
           (local_58.m.ptr == (QAbstractItemModel *)0x0)) goto LAB_0057e37b;
      }
      else {
LAB_0057e37b:
        e[0xc] = (QDragMoveEvent)0x1;
      }
      auVar29._0_8_ =
           (double)((ulong)*(double *)(e + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
           *(double *)(e + 0x10);
      auVar29._8_8_ =
           (double)((ulong)*(double *)(e + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
           *(double *)(e + 0x18);
      auVar23 = minpd(_DAT_0066f5d0,auVar29);
      auVar30._8_8_ = -(ulong)(-2147483648.0 < auVar23._8_8_);
      auVar30._0_8_ = -(ulong)(-2147483648.0 < auVar23._0_8_);
      uVar15 = movmskpd(uVar16,auVar30);
      uVar13 = 0x8000000000000000;
      if ((uVar15 & 2) != 0) {
        uVar13 = (ulong)(uint)(int)auVar23._8_8_ << 0x20;
      }
      uVar18 = 0x80000000;
      if ((uVar15 & 1) != 0) {
        uVar18 = (ulong)(uint)(int)auVar23._0_8_;
      }
      local_88 = (QPoint)(uVar18 | uVar13);
      bVar8 = QAbstractItemViewPrivate::shouldAutoScroll
                        (&((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate,
                         &local_88);
      if (bVar8) {
        pQVar3 = (this->super_QCommonListViewBase).dd;
        uVar21 = 50000000;
        if ((pQVar3->super_QAbstractItemViewPrivate).verticalScrollMode == ScrollPerItem) {
          uVar21 = 150000000;
        }
        QBasicTimer::start(&(pQVar3->super_QAbstractItemViewPrivate).autoScrollTimer,uVar21,1,
                           *(undefined8 *)
                            &(pQVar3->super_QAbstractItemViewPrivate).
                             super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                             super_QWidgetPrivate.field_0x8);
        (pQVar3->super_QAbstractItemViewPrivate).autoScrollCount = 0;
      }
      bVar8 = true;
      goto LAB_0057e22b;
    }
  }
  (**(code **)(*(long *)e + 0x10))(e,QVar1);
  bVar8 = false;
LAB_0057e22b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar8;
  }
  __stack_chk_fail();
}

Assistant:

bool QIconModeViewBase::filterDragMoveEvent(QDragMoveEvent *e)
{
    const bool wasAccepted = e->isAccepted();

    // ignore by default
    e->ignore();

    if (e->source() != qq || !dd->canDrop(e)) {
        // restore previous acceptance on failure
        e->setAccepted(wasAccepted);
        return false;
    }

    // get old dragged items rect
    QRect itemsRect = this->itemsRect(draggedItems);
    viewport()->update(itemsRect.translated(draggedItemsDelta()));
    // update position
    draggedItemsPos = e->position().toPoint();
    // get new items rect
    viewport()->update(itemsRect.translated(draggedItemsDelta()));
    // set the item under the cursor to current
    QModelIndex index;
    if (movement() == QListView::Snap) {
        QRect rect(snapToGrid(e->position().toPoint() + offset()), gridSize());
        const QList<QModelIndex> intersectVector = intersectingSet(rect);
        index = intersectVector.size() > 0 ? intersectVector.last() : QModelIndex();
    } else {
        index = qq->indexAt(e->position().toPoint());
    }
    // check if we allow drops here
    if (draggedItems.contains(index))
        e->accept(); // allow changing item position
    else if (dd->model->flags(index) & Qt::ItemIsDropEnabled)
        e->accept(); // allow dropping on dropenabled items
    else if (!index.isValid())
        e->accept(); // allow dropping in empty areas

    // the event was treated. do autoscrolling
    if (dd->shouldAutoScroll(e->position().toPoint()))
        dd->startAutoScroll();
    return true;
}